

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_4_6_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  float *data;
  int c2;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  int c1;
  long lVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  float *pfVar53;
  float *pfVar54;
  long lVar55;
  long lVar56;
  int k_count;
  int iVar57;
  ulong uVar58;
  int c2_2;
  int iVar59;
  int iVar60;
  float *pfVar61;
  int c1_2;
  int iVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  int scale;
  float *pfVar67;
  ulong uVar68;
  byte bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  float fVar106;
  undefined1 auVar108 [12];
  undefined1 auVar107 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  undefined1 auVar112 [64];
  int data_width;
  int local_148;
  float local_b8;
  
  auVar78._8_4_ = 0x3effffff;
  auVar78._0_8_ = 0x3effffff3effffff;
  auVar78._12_4_ = 0x3effffff;
  auVar107 = ZEXT1664(auVar78);
  auVar77._8_4_ = 0x80000000;
  auVar77._0_8_ = 0x8000000080000000;
  auVar77._12_4_ = 0x80000000;
  auVar105 = ZEXT1664(auVar77);
  fVar85 = ipoint->scale;
  auVar112 = ZEXT464((uint)fVar85);
  auVar70 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)fVar85),auVar77,0xf8);
  auVar70 = ZEXT416((uint)(fVar85 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  fVar83 = -0.08 / (fVar85 * fVar85);
  scale = (int)auVar70._0_4_;
  auVar71._0_4_ = (int)auVar70._0_4_;
  auVar71._4_4_ = (int)auVar70._4_4_;
  auVar71._8_4_ = (int)auVar70._8_4_;
  auVar71._12_4_ = (int)auVar70._12_4_;
  auVar70 = vcvtdq2ps_avx(auVar71);
  auVar71 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)ipoint->x),auVar77,0xf8);
  auVar71 = ZEXT416((uint)(ipoint->x + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72._0_8_ = (double)auVar71._0_4_;
  auVar72._8_8_ = auVar71._8_8_;
  auVar76._0_8_ = (double)fVar85;
  auVar76._8_8_ = 0;
  auVar71 = vfmadd231sd_fma(auVar72,auVar76,ZEXT816(0x3fe0000000000000));
  auVar75._0_4_ = (float)auVar71._0_8_;
  auVar75._4_12_ = auVar71._4_12_;
  auVar71 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)ipoint->y),auVar77,0xf8);
  fVar8 = auVar75._0_4_ - auVar70._0_4_;
  auVar71 = ZEXT416((uint)(ipoint->y + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar73._0_8_ = (double)auVar71._0_4_;
  auVar73._8_8_ = auVar71._8_8_;
  auVar71 = vfmadd231sd_fma(auVar73,auVar76,ZEXT816(0x3fe0000000000000));
  auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar85),auVar75);
  auVar74._0_4_ = (float)auVar71._0_8_;
  auVar74._4_12_ = auVar71._4_12_;
  fVar111 = auVar74._0_4_ - auVar70._0_4_;
  auVar70 = vpternlogd_avx512vl(auVar78,auVar72,auVar77,0xf8);
  auVar70 = ZEXT416((uint)(auVar72._0_4_ + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = ZEXT416((uint)fVar85);
  if (scale < (int)auVar70._0_4_) {
    auVar79._8_4_ = 0x3effffff;
    auVar79._0_8_ = 0x3effffff3effffff;
    auVar79._12_4_ = 0x3effffff;
    auVar80._8_4_ = 0x80000000;
    auVar80._0_8_ = 0x8000000080000000;
    auVar80._12_4_ = 0x80000000;
    auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar71,auVar74);
    auVar72 = vpternlogd_avx512vl(auVar80,auVar70,auVar79,0xea);
    auVar70 = ZEXT416((uint)(auVar70._0_4_ + auVar72._0_4_));
    auVar70 = vroundss_avx(auVar70,auVar70,0xb);
    if (scale < (int)auVar70._0_4_) {
      auVar70 = vfmadd231ss_fma(auVar75,auVar71,ZEXT416(0x41300000));
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      auVar72 = vpternlogd_avx512vl(auVar81,auVar70,auVar79,0xea);
      auVar70 = ZEXT416((uint)(auVar70._0_4_ + auVar72._0_4_));
      auVar70 = vroundss_avx(auVar70,auVar70,0xb);
      if ((int)auVar70._0_4_ + scale <= iimage->width) {
        auVar70 = vfmadd231ss_fma(auVar74,auVar71,ZEXT416(0x41300000));
        auVar19._8_4_ = 0x80000000;
        auVar19._0_8_ = 0x8000000080000000;
        auVar19._12_4_ = 0x80000000;
        auVar72 = vpternlogd_avx512vl(auVar79,auVar70,auVar19,0xf8);
        auVar70 = ZEXT416((uint)(auVar70._0_4_ + auVar72._0_4_));
        auVar70 = vroundss_avx(auVar70,auVar70,0xb);
        if ((int)auVar70._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar53 = iimage->data;
          iVar45 = scale * 2;
          fVar8 = fVar8 + 0.5;
          fVar111 = fVar111 + 0.5;
          pfVar67 = haarResponseY + 0x4d;
          pfVar61 = haarResponseX + 0x4d;
          uVar41 = 0xfffffff4;
          do {
            auVar70._0_4_ = (float)(int)uVar41;
            auVar108 = in_ZMM8._4_12_;
            auVar70._4_12_ = auVar108;
            lVar65 = 0;
            auVar100._0_4_ = (float)(int)(uVar41 | 1);
            auVar100._4_12_ = auVar108;
            auVar103._0_4_ = (float)(int)(uVar41 | 2);
            auVar103._4_12_ = auVar108;
            auVar70 = vfmadd213ss_fma(auVar70,auVar71,ZEXT416((uint)fVar111));
            auVar72 = vfmadd213ss_fma(auVar100,auVar71,ZEXT416((uint)fVar111));
            auVar73 = vfmadd213ss_fma(auVar103,auVar71,ZEXT416((uint)fVar111));
            iVar28 = (int)auVar70._0_4_;
            iVar32 = (int)auVar72._0_4_;
            auVar101._0_4_ = (float)(int)(uVar41 | 3);
            auVar101._4_12_ = auVar108;
            iVar29 = (int)auVar73._0_4_;
            auVar70 = vfmadd213ss_fma(auVar101,auVar71,ZEXT416((uint)fVar111));
            iVar35 = (iVar28 + -1) * iVar1;
            iVar27 = (iVar28 + -1 + scale) * iVar1;
            iVar31 = (iVar28 + -1 + iVar45) * iVar1;
            iVar30 = (int)auVar70._0_4_;
            iVar36 = (iVar32 + -1 + iVar45) * iVar1;
            iVar38 = (iVar32 + -1) * iVar1;
            iVar28 = (iVar32 + -1 + scale) * iVar1;
            iVar32 = (iVar29 + -1) * iVar1;
            iVar37 = (iVar29 + -1 + iVar45) * iVar1;
            iVar29 = (iVar29 + -1 + scale) * iVar1;
            iVar34 = (iVar30 + -1) * iVar1;
            iVar33 = (iVar30 + -1 + iVar45) * iVar1;
            iVar30 = (iVar30 + -1 + scale) * iVar1;
            do {
              iVar39 = (int)lVar65;
              auVar93._0_4_ = (float)(iVar39 + -0xc);
              auVar108 = auVar107._4_12_;
              auVar93._4_12_ = auVar108;
              auVar70 = vfmadd213ss_fma(auVar93,auVar71,ZEXT416((uint)fVar8));
              iVar51 = (int)auVar70._0_4_;
              auVar94._0_4_ = (float)(iVar39 + -0xb);
              auVar94._4_12_ = auVar108;
              auVar70 = vfmadd213ss_fma(auVar94,auVar71,ZEXT416((uint)fVar8));
              iVar49 = iVar51 + -1 + scale;
              iVar50 = (int)auVar70._0_4_;
              auVar95._0_4_ = (float)(iVar39 + -10);
              auVar95._4_12_ = auVar108;
              auVar104._0_4_ = (float)(iVar39 + -9);
              auVar104._4_12_ = auVar108;
              auVar102._0_4_ = (float)(iVar39 + -8);
              auVar102._4_12_ = auVar108;
              auVar74 = ZEXT416((uint)fVar8);
              auVar70 = vfmadd213ss_fma(auVar95,auVar71,auVar74);
              auVar72 = vfmadd213ss_fma(auVar104,auVar71,auVar74);
              auVar73 = vfmadd213ss_fma(auVar102,auVar71,auVar74);
              iVar46 = (int)auVar70._0_4_;
              auVar96._0_4_ = (float)(iVar39 + -7);
              auVar96._4_12_ = in_ZMM8._4_12_;
              iVar40 = iVar51 + -1 + iVar45;
              fVar85 = pfVar53[iVar31 + -1 + iVar51];
              auVar70 = vfmadd213ss_fma(auVar96,auVar71,auVar74);
              fVar84 = pfVar53[iVar35 + iVar40];
              auVar76 = SUB6416(ZEXT464(0x40000000),0);
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar35 + iVar49] -
                                                      pfVar53[iVar31 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar40] -
                                                      pfVar53[iVar35 + -1 + iVar51])));
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar51] -
                                                      pfVar53[iVar27 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar40] -
                                                      pfVar53[iVar35 + -1 + iVar51])));
              pfVar61[lVar65 + -0x4d] = (fVar85 - fVar84) + auVar74._0_4_;
              pfVar67[lVar65 + -0x4d] = auVar75._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar36 + -1 + iVar51];
              fVar84 = pfVar53[iVar38 + iVar40];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar49] -
                                                      pfVar53[iVar36 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar40] -
                                                      pfVar53[iVar38 + -1 + iVar51])));
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar28 + -1 + iVar51] -
                                                      pfVar53[iVar28 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar40] -
                                                      pfVar53[iVar38 + -1 + iVar51])));
              pfVar61[lVar65 + -0x35] = (fVar85 - fVar84) + auVar74._0_4_;
              pfVar67[lVar65 + -0x35] = auVar75._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar37 + -1 + iVar51];
              fVar84 = pfVar53[iVar32 + iVar40];
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar32 + iVar49] -
                                                      pfVar53[iVar37 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar40] -
                                                      pfVar53[iVar32 + -1 + iVar51])));
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + -1 + iVar51] -
                                                      pfVar53[iVar29 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar40] -
                                                      pfVar53[iVar32 + -1 + iVar51])));
              pfVar61[lVar65 + -0x1d] = (fVar85 - fVar84) + auVar74._0_4_;
              pfVar67[lVar65 + -0x1d] = auVar75._0_4_ - (fVar85 - fVar84);
              iVar48 = (int)auVar72._0_4_;
              fVar85 = pfVar53[iVar33 + -1 + iVar51];
              iVar57 = iVar50 + -1 + iVar45;
              fVar84 = pfVar53[iVar34 + iVar40];
              iVar62 = iVar50 + -1 + scale;
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar49] -
                                                      pfVar53[iVar49 + iVar33])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar40 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar51])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + -1 + iVar51] -
                                                      pfVar53[iVar30 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar40 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar51])));
              pfVar61[lVar65 + -5] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -5] = auVar74._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar31 + -1 + iVar50];
              fVar84 = pfVar53[iVar35 + iVar57];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar35 + iVar62] -
                                                      pfVar53[iVar31 + iVar62])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar57] -
                                                      pfVar53[iVar35 + -1 + iVar50])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar50] -
                                                      pfVar53[iVar27 + iVar57])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar57] -
                                                      pfVar53[iVar35 + -1 + iVar50])));
              pfVar61[lVar65 + -0x4c] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -0x4c] = auVar74._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar36 + -1 + iVar50];
              fVar84 = pfVar53[iVar38 + iVar57];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar62] -
                                                      pfVar53[iVar36 + iVar62])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar57] -
                                                      pfVar53[iVar38 + -1 + iVar50])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar28 + -1 + iVar50] -
                                                      pfVar53[iVar28 + iVar57])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar57] -
                                                      pfVar53[iVar38 + -1 + iVar50])));
              pfVar61[lVar65 + -0x34] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -0x34] = auVar74._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar37 + -1 + iVar50];
              fVar84 = pfVar53[iVar32 + iVar57];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar32 + iVar62] -
                                                      pfVar53[iVar37 + iVar62])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar57] -
                                                      pfVar53[iVar32 + -1 + iVar50])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + -1 + iVar50] -
                                                      pfVar53[iVar29 + iVar57])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar57] -
                                                      pfVar53[iVar32 + -1 + iVar50])));
              pfVar61[lVar65 + -0x1c] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -0x1c] = auVar74._0_4_ - (fVar85 - fVar84);
              iVar49 = iVar46 + -1 + iVar45;
              fVar85 = pfVar53[iVar33 + -1 + iVar50];
              fVar84 = pfVar53[iVar34 + iVar57];
              iVar51 = iVar46 + -1 + scale;
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar62] -
                                                      pfVar53[iVar62 + iVar33])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar57 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar50])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + -1 + iVar50] -
                                                      pfVar53[iVar30 + iVar57])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar57 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar50])));
              pfVar61[lVar65 + -4] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -4] = auVar74._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar31 + -1 + iVar46];
              fVar84 = pfVar53[iVar35 + iVar49];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar46] -
                                                      pfVar53[iVar27 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar49] -
                                                      pfVar53[iVar35 + -1 + iVar46])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar35 + iVar51] -
                                                      pfVar53[iVar31 + iVar51])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar49] -
                                                      pfVar53[iVar35 + -1 + iVar46])));
              pfVar61[lVar65 + -0x4b] = (fVar85 - fVar84) + auVar74._0_4_;
              pfVar67[lVar65 + -0x4b] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar36 + -1 + iVar46];
              fVar84 = pfVar53[iVar38 + iVar49];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar28 + -1 + iVar46] -
                                                      pfVar53[iVar28 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar49] -
                                                      pfVar53[iVar38 + -1 + iVar46])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar51] -
                                                      pfVar53[iVar36 + iVar51])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar49] -
                                                      pfVar53[iVar38 + -1 + iVar46])));
              pfVar61[lVar65 + -0x33] = (fVar85 - fVar84) + auVar74._0_4_;
              pfVar67[lVar65 + -0x33] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar37 + -1 + iVar46];
              fVar84 = pfVar53[iVar32 + iVar49];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + -1 + iVar46] -
                                                      pfVar53[iVar29 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar49] -
                                                      pfVar53[iVar32 + -1 + iVar46])));
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar32 + iVar51] -
                                                      pfVar53[iVar37 + iVar51])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar49] -
                                                      pfVar53[iVar32 + -1 + iVar46])));
              pfVar61[lVar65 + -0x1b] = (fVar85 - fVar84) + auVar74._0_4_;
              pfVar67[lVar65 + -0x1b] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar33 + -1 + iVar46];
              fVar84 = pfVar53[iVar34 + iVar49];
              in_ZMM8 = ZEXT464((uint)pfVar53[iVar49 + iVar33]);
              iVar50 = (int)auVar73._0_4_;
              iVar57 = iVar48 + -1 + iVar45;
              iVar40 = iVar48 + -1 + scale;
              auVar73 = ZEXT416((uint)(pfVar53[iVar49 + iVar33] - pfVar53[iVar34 + -1 + iVar46]));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar51] -
                                                      pfVar53[iVar51 + iVar33])),auVar76,auVar73);
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + -1 + iVar46] -
                                                      pfVar53[iVar30 + iVar49])),auVar76,auVar73);
              pfVar61[lVar65 + -3] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -3] = auVar73._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar31 + -1 + iVar48];
              fVar84 = pfVar53[iVar35 + iVar57];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar35 + iVar40] -
                                                      pfVar53[iVar31 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar57] -
                                                      pfVar53[iVar35 + -1 + iVar48])));
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar48] -
                                                      pfVar53[iVar27 + iVar57])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar57] -
                                                      pfVar53[iVar35 + -1 + iVar48])));
              pfVar61[lVar65 + -0x4a] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -0x4a] = auVar73._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar36 + -1 + iVar48];
              fVar84 = pfVar53[iVar38 + iVar57];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar40] -
                                                      pfVar53[iVar36 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar57] -
                                                      pfVar53[iVar38 + -1 + iVar48])));
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar28 + -1 + iVar48] -
                                                      pfVar53[iVar28 + iVar57])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar57] -
                                                      pfVar53[iVar38 + -1 + iVar48])));
              pfVar61[lVar65 + -0x32] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -0x32] = auVar73._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar37 + -1 + iVar48];
              fVar84 = pfVar53[iVar32 + iVar57];
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar32 + iVar40] -
                                                      pfVar53[iVar37 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar57] -
                                                      pfVar53[iVar32 + -1 + iVar48])));
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + -1 + iVar48] -
                                                      pfVar53[iVar29 + iVar57])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar57] -
                                                      pfVar53[iVar32 + -1 + iVar48])));
              pfVar61[lVar65 + -0x1a] = (fVar85 - fVar84) + auVar72._0_4_;
              pfVar67[lVar65 + -0x1a] = auVar73._0_4_ - (fVar85 - fVar84);
              iVar49 = iVar50 + -1 + iVar45;
              auVar107 = ZEXT464((uint)pfVar53[iVar57 + iVar33]);
              iVar62 = (int)auVar70._0_4_;
              fVar85 = pfVar53[iVar33 + -1 + iVar48];
              fVar84 = pfVar53[iVar34 + iVar57];
              auVar72 = ZEXT416((uint)(pfVar53[iVar57 + iVar33] - pfVar53[iVar34 + -1 + iVar48]));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar40] -
                                                      pfVar53[iVar40 + iVar33])),auVar76,auVar72);
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + -1 + iVar48] -
                                                      pfVar53[iVar30 + iVar57])),auVar76,auVar72);
              pfVar61[lVar65 + -2] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -2] = auVar72._0_4_ - (fVar85 - fVar84);
              iVar40 = iVar50 + -1 + scale;
              fVar85 = pfVar53[iVar31 + -1 + iVar50];
              fVar84 = pfVar53[iVar35 + iVar49];
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar35 + iVar40] -
                                                      pfVar53[iVar31 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar49] -
                                                      pfVar53[iVar35 + -1 + iVar50])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar50] -
                                                      pfVar53[iVar27 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar49] -
                                                      pfVar53[iVar35 + -1 + iVar50])));
              pfVar61[lVar65 + -0x49] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -0x49] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar36 + -1 + iVar50];
              fVar84 = pfVar53[iVar38 + iVar49];
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar40] -
                                                      pfVar53[iVar36 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar49] -
                                                      pfVar53[iVar38 + -1 + iVar50])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar28 + -1 + iVar50] -
                                                      pfVar53[iVar28 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar49] -
                                                      pfVar53[iVar38 + -1 + iVar50])));
              pfVar61[lVar65 + -0x31] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -0x31] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar37 + -1 + iVar50];
              fVar84 = pfVar53[iVar32 + iVar49];
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar32 + iVar40] -
                                                      pfVar53[iVar37 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar49] -
                                                      pfVar53[iVar32 + -1 + iVar50])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + -1 + iVar50] -
                                                      pfVar53[iVar29 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar49] -
                                                      pfVar53[iVar32 + -1 + iVar50])));
              pfVar61[lVar65 + -0x19] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -0x19] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar33 + -1 + iVar50];
              fVar84 = pfVar53[iVar34 + iVar49];
              iVar48 = iVar62 + -1 + iVar45;
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar40] -
                                                      pfVar53[iVar40 + iVar33])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar49 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar50])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + -1 + iVar50] -
                                                      pfVar53[iVar30 + iVar49])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar49 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar50])));
              pfVar61[lVar65 + -1] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -1] = auVar72._0_4_ - (fVar85 - fVar84);
              iVar40 = iVar62 + -1 + scale;
              fVar85 = pfVar53[iVar31 + -1 + iVar62];
              fVar84 = pfVar53[iVar35 + iVar48];
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar35 + iVar40] -
                                                      pfVar53[iVar31 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar48] -
                                                      pfVar53[iVar35 + -1 + iVar62])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar62] -
                                                      pfVar53[iVar27 + iVar48])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar48] -
                                                      pfVar53[iVar35 + -1 + iVar62])));
              pfVar61[lVar65 + -0x48] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -0x48] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar36 + -1 + iVar62];
              fVar84 = pfVar53[iVar38 + iVar48];
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar40] -
                                                      pfVar53[iVar36 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar48] -
                                                      pfVar53[iVar38 + -1 + iVar62])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar28 + -1 + iVar62] -
                                                      pfVar53[iVar28 + iVar48])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar36 + iVar48] -
                                                      pfVar53[iVar38 + -1 + iVar62])));
              pfVar61[lVar65 + -0x30] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -0x30] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar37 + -1 + iVar62];
              fVar84 = pfVar53[iVar32 + iVar48];
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar32 + iVar40] -
                                                      pfVar53[iVar37 + iVar40])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar48] -
                                                      pfVar53[iVar32 + -1 + iVar62])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + -1 + iVar62] -
                                                      pfVar53[iVar29 + iVar48])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar37 + iVar48] -
                                                      pfVar53[iVar32 + -1 + iVar62])));
              pfVar61[lVar65 + -0x18] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65 + -0x18] = auVar72._0_4_ - (fVar85 - fVar84);
              fVar85 = pfVar53[iVar33 + -1 + iVar62];
              fVar84 = pfVar53[iVar34 + iVar48];
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar40] -
                                                      pfVar53[iVar40 + iVar33])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar48 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar62])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar30 + -1 + iVar62] -
                                                      pfVar53[iVar30 + iVar48])),auVar76,
                                        ZEXT416((uint)(pfVar53[iVar48 + iVar33] -
                                                      pfVar53[iVar34 + -1 + iVar62])));
              pfVar61[lVar65] = (fVar85 - fVar84) + auVar70._0_4_;
              pfVar67[lVar65] = auVar72._0_4_ - (fVar85 - fVar84);
              lVar65 = lVar65 + 6;
            } while (iVar39 + -0xc < 6);
            pfVar67 = pfVar67 + 0x60;
            pfVar61 = pfVar61 + 0x60;
            bVar3 = (int)uVar41 < 8;
            uVar41 = uVar41 + 4;
          } while (bVar3);
          goto LAB_0022125f;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar65 = 0;
  uVar41 = 0xfffffff4;
  do {
    auVar70 = vpbroadcastd_avx512vl();
    auVar20._8_4_ = 3;
    auVar20._0_8_ = 0x200000003;
    auVar20._12_4_ = 2;
    auVar70 = vporq_avx512vl(auVar70,auVar20);
    auVar26._4_4_ = fVar111;
    auVar26._0_4_ = fVar111;
    auVar26._8_4_ = fVar111;
    auVar26._12_4_ = fVar111;
    auVar70 = vpinsrd_avx(auVar70,uVar41 | 1,2);
    auVar70 = vpinsrd_avx(auVar70,uVar41,3);
    auVar70 = vcvtdq2ps_avx(auVar70);
    auVar23._4_4_ = fVar85;
    auVar23._0_4_ = fVar85;
    auVar23._8_4_ = fVar85;
    auVar23._12_4_ = fVar85;
    auVar70 = vfmadd132ps_fma(auVar70,auVar26,auVar23);
    uVar42 = vcmpps_avx512vl(auVar70,_DAT_00599190,0xd);
    auVar7 = vcvtps2pd_avx(auVar70);
    auVar88._8_8_ = 0xbfe0000000000000;
    auVar88._0_8_ = 0xbfe0000000000000;
    auVar88._16_8_ = 0xbfe0000000000000;
    auVar88._24_8_ = 0xbfe0000000000000;
    auVar82._12_4_ = 0x3fe00000;
    auVar82._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar82._16_8_ = 0x3fe0000000000000;
    auVar82._24_8_ = 0x3fe0000000000000;
    auVar82 = vblendmpd_avx512vl(auVar88,auVar82);
    bVar3 = (bool)((byte)uVar42 & 1);
    bVar4 = (bool)((byte)(uVar42 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar42 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar42 >> 3) & 1);
    auVar86._0_4_ =
         (int)((double)((ulong)bVar3 * auVar82._0_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar7._0_8_);
    auVar86._4_4_ =
         (int)((double)((ulong)bVar4 * auVar82._8_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar7._8_8_);
    auVar86._8_4_ =
         (int)((double)((ulong)bVar5 * auVar82._16_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar7._16_8_);
    auVar86._12_4_ =
         (int)((double)((ulong)bVar6 * auVar82._24_8_ | (ulong)!bVar6 * -0x4020000000000000) +
              auVar7._24_8_);
    auVar21._8_4_ = 1;
    auVar21._0_8_ = 0x100000001;
    auVar21._12_4_ = 1;
    uVar42 = vpcmpd_avx512vl(auVar86,auVar21,1);
    uVar68 = uVar42 & 0xf;
    iVar31 = iVar1 + auVar86._12_4_;
    iVar32 = auVar86._12_4_ + -1 + scale;
    iVar33 = iVar1 + -1 + auVar86._12_4_;
    iVar27 = auVar86._12_4_ + -1;
    uVar58 = uVar68 >> 1;
    iVar34 = iVar1 + auVar86._8_4_;
    iVar35 = auVar86._8_4_ + -1 + scale;
    iVar36 = auVar86._8_4_ + -1;
    iVar28 = iVar1 + -1 + auVar86._8_4_;
    iVar37 = iVar1 + auVar86._4_4_;
    iVar38 = auVar86._4_4_ + -1;
    uVar43 = uVar68 >> 2;
    uVar68 = uVar68 >> 3;
    iVar39 = auVar86._4_4_ + -1 + scale;
    iVar29 = iVar1 + -1 + auVar86._4_4_;
    iVar48 = auVar86._0_4_ + -1 + scale;
    iVar40 = iVar1 + auVar86._0_4_;
    iVar49 = iVar1 + -1 + auVar86._0_4_;
    iVar30 = auVar86._0_4_ + -1;
    pfVar53 = haarResponseX;
    pfVar67 = haarResponseY;
    lVar64 = lVar65;
    iVar45 = -0xc;
    do {
      auVar87._0_4_ = (float)iVar45;
      auVar87._4_12_ = auVar105._4_12_;
      auVar70 = vfmadd213ss_fma(auVar87,auVar112._0_16_,ZEXT416((uint)fVar8));
      auVar98._0_4_ = (float)(iVar45 + 1);
      auVar98._4_12_ = auVar105._4_12_;
      fVar84 = auVar70._0_4_;
      auVar70 = vfmadd213ss_fma(auVar98,auVar112._0_16_,ZEXT416((uint)fVar8));
      fVar97 = auVar70._0_4_;
      iVar62 = (int)((double)((ulong)(0.0 <= fVar84) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar84) * -0x4020000000000000) + (double)fVar84);
      if ((iVar62 < 1 || uVar68 != 0) || (iimage->height < iVar31)) {
LAB_0021f441:
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._12_4_,iVar62,scale,(float *)((long)pfVar53 + lVar64),
               (float *)((long)pfVar67 + lVar64));
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar46 = iimage->width;
        iVar50 = iVar1 + iVar62;
        if (iVar46 < iVar50) goto LAB_0021f441;
        iVar51 = iimage->data_width;
        pfVar61 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar57 = iVar51 * iVar27;
        iVar60 = iVar51 * iVar33;
        fVar84 = pfVar61[iVar60 + -1 + iVar62];
        fVar9 = pfVar61[iVar57 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar61[iVar57 + iVar59] - pfVar61[iVar60 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar61[iVar60 + -1 + iVar50] -
                                                pfVar61[iVar57 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar61[iVar51 * iVar32 + -1 + iVar62] -
                                                pfVar61[iVar51 * iVar32 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar61[iVar60 + -1 + iVar50] -
                                                pfVar61[iVar57 + -1 + iVar62])));
        *(float *)((long)pfVar53 + lVar64) = (fVar84 - fVar9) + auVar70._0_4_;
        *(float *)((long)pfVar67 + lVar64) = auVar72._0_4_ - (fVar84 - fVar9);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x60);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0x60);
      if (((iVar62 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._8_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar36;
        iVar57 = iVar51 * iVar28;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar9 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar35 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar9) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar9);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0xc0);
      pfVar54 = (float *)(lVar64 + 0xc0 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._4_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar38;
        iVar57 = iVar51 * iVar29;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar9 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar39 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar39 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar9) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar9);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x120);
      pfVar54 = (float *)(lVar64 + 0x120 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._0_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar60 = iVar62 + -1 + scale;
        iVar57 = iVar51 * iVar30;
        iVar59 = iVar51 * iVar49;
        fVar84 = pfVar2[iVar59 + -1 + iVar62];
        fVar9 = pfVar2[iVar57 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 + iVar60] - pfVar2[iVar59 + iVar60]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar48 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar48 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar9) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar9);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 4);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 4);
      iVar62 = (int)((double)((ulong)(0.0 <= fVar97) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar97) * -0x4020000000000000) + (double)fVar97);
      if (((iVar62 < 1 || uVar68 != 0) || (iimage->height < iVar31)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._12_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar27;
        iVar57 = iVar51 * iVar33;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar32 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar32 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 100);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 100);
      if (((iVar62 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._8_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar36;
        iVar57 = iVar51 * iVar28;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar35 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0xc4);
      pfVar54 = (float *)(lVar64 + 0xc4 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._4_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar38;
        iVar57 = iVar51 * iVar29;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar39 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar39 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x124);
      pfVar54 = (float *)(lVar64 + 0x124 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._0_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar60 = iVar62 + -1 + scale;
        iVar57 = iVar51 * iVar30;
        iVar59 = iVar51 * iVar49;
        fVar84 = pfVar2[iVar59 + -1 + iVar62];
        fVar97 = pfVar2[iVar57 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 + iVar60] - pfVar2[iVar59 + iVar60]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar48 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar48 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      auVar70 = vpbroadcastd_avx512vl();
      auVar70 = vpaddd_avx(auVar70,_DAT_00599790);
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 8);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 8);
      auVar70 = vcvtdq2ps_avx(auVar70);
      auVar25._4_4_ = fVar8;
      auVar25._0_4_ = fVar8;
      auVar25._8_4_ = fVar8;
      auVar25._12_4_ = fVar8;
      auVar24._4_4_ = fVar85;
      auVar24._0_4_ = fVar85;
      auVar24._8_4_ = fVar85;
      auVar24._12_4_ = fVar85;
      auVar72 = vfmadd132ps_fma(auVar70,auVar25,auVar24);
      auVar70 = vshufps_avx(auVar72,auVar72,0xff);
      uVar18 = vcmpps_avx512vl(auVar72,_DAT_00599190,0xd);
      bVar69 = (byte)(uVar18 >> 3);
      iVar62 = (int)((double)((ulong)(bVar69 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar69 & 1) * -0x4020000000000000) +
                    (double)auVar70._0_4_);
      if (((iVar62 < 1 || uVar68 != 0) || (iimage->height < iVar31)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._12_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar27;
        iVar57 = iVar51 * iVar33;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar32 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar32 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x68);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0x68);
      if (((iVar62 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._8_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar36;
        iVar57 = iVar51 * iVar28;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar35 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 200);
      pfVar54 = (float *)(lVar64 + 200 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._4_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar38;
        iVar57 = iVar51 * iVar29;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar39 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar39 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x128);
      pfVar54 = (float *)(lVar64 + 0x128 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._0_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar60 = iVar62 + -1 + scale;
        iVar57 = iVar51 * iVar30;
        iVar59 = iVar51 * iVar49;
        fVar84 = pfVar2[iVar59 + -1 + iVar62];
        fVar97 = pfVar2[iVar57 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 + iVar60] - pfVar2[iVar59 + iVar60]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar48 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar48 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      auVar70 = vpermilpd_avx(auVar72,1);
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0xc);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0xc);
      bVar69 = (byte)uVar18;
      iVar62 = (int)((double)((ulong)(bVar69 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar69 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar70._0_4_);
      if (((iVar62 < 1 || uVar68 != 0) || (iimage->height < iVar31)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._12_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar27;
        iVar57 = iVar51 * iVar33;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar32 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar32 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x6c);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0x6c);
      if (((iVar62 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._8_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar36;
        iVar57 = iVar51 * iVar28;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar35 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0xcc);
      pfVar54 = (float *)(lVar64 + 0xcc + (long)pfVar67);
      if (((iVar62 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._4_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar38;
        iVar57 = iVar51 * iVar29;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar39 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar39 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 300);
      pfVar54 = (float *)(lVar64 + 300 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._0_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar60 = iVar62 + -1 + scale;
        iVar57 = iVar51 * iVar30;
        iVar59 = iVar51 * iVar49;
        fVar84 = pfVar2[iVar59 + -1 + iVar62];
        fVar97 = pfVar2[iVar57 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 + iVar60] - pfVar2[iVar59 + iVar60]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar48 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar48 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      auVar70 = vmovshdup_avx(auVar72);
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x10);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0x10);
      iVar62 = (int)((double)((ulong)(bVar69 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar69 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar70._0_4_);
      if (((iVar62 < 1 || uVar68 != 0) || (iimage->height < iVar31)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._12_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar27;
        iVar57 = iVar51 * iVar33;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar32 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar32 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x70);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0x70);
      if (((iVar62 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._8_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar36;
        iVar57 = iVar51 * iVar28;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar35 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0xd0);
      pfVar54 = (float *)(lVar64 + 0xd0 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._4_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar38;
        iVar57 = iVar51 * iVar29;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar39 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar39 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x130);
      pfVar54 = (float *)(lVar64 + 0x130 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._0_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar60 = iVar62 + -1 + scale;
        iVar57 = iVar51 * iVar30;
        iVar59 = iVar51 * iVar49;
        fVar84 = pfVar2[iVar59 + -1 + iVar62];
        fVar97 = pfVar2[iVar57 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 + iVar60] - pfVar2[iVar59 + iVar60]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        auVar73 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar48 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar48 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar50] -
                                                pfVar2[iVar57 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar73._0_4_ - (fVar84 - fVar97);
      }
      local_b8 = auVar72._0_4_;
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x14);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0x14);
      iVar62 = (int)((double)((ulong)(bVar69 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar69 & 1) * -0x4020000000000000) + (double)local_b8);
      if (((iVar62 < 1 || uVar68 != 0) || (iimage->height < iVar31)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._12_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar27;
        iVar57 = iVar51 * iVar33;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar32 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar32 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x74);
      pfVar54 = (float *)((long)pfVar67 + lVar64 + 0x74);
      if (((iVar62 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar34)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._8_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar36;
        iVar57 = iVar51 * iVar28;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar35 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0xd4);
      pfVar54 = (float *)(lVar64 + 0xd4 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar37)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._4_4_,iVar62,scale,pfVar61,pfVar54);
        iVar46 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar51 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar62 + -1 + scale;
        iVar60 = iVar51 * iVar38;
        iVar57 = iVar51 * iVar29;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar57 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 * iVar39 + -1 + iVar62] -
                                                pfVar2[iVar51 * iVar39 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      pfVar61 = (float *)((long)pfVar53 + lVar64 + 0x134);
      pfVar54 = (float *)(lVar64 + 0x134 + (long)pfVar67);
      if (((iVar62 < 1 || (uVar42 & 1) != 0) || (iimage->height < iVar40)) ||
         (iVar50 = iVar1 + iVar62, iVar46 < iVar50)) {
        auVar105 = ZEXT1664(auVar105._0_16_);
        haarXY(iimage,auVar86._0_4_,iVar62,scale,pfVar61,pfVar54);
        pfVar53 = haarResponseX;
        pfVar67 = haarResponseY;
      }
      else {
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar51 = iVar62 + -1 + scale;
        iVar60 = iVar46 * iVar30;
        iVar57 = iVar46 * iVar49;
        fVar84 = pfVar2[iVar57 + -1 + iVar62];
        fVar97 = pfVar2[iVar60 + -1 + iVar50];
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar51] - pfVar2[iVar57 + iVar51]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar48 + -1 + iVar62] -
                                                pfVar2[iVar46 * iVar48 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar57 + -1 + iVar50] -
                                                pfVar2[iVar60 + -1 + iVar62])));
        *pfVar61 = (fVar84 - fVar97) + auVar70._0_4_;
        *pfVar54 = auVar72._0_4_ - (fVar84 - fVar97);
      }
      auVar112 = ZEXT1664(auVar71);
      lVar64 = lVar64 + 0x18;
      bVar3 = iVar45 < 6;
      iVar45 = iVar45 + 6;
    } while (bVar3);
    lVar65 = lVar65 + 0x180;
    bVar3 = (int)uVar41 < 8;
    uVar41 = uVar41 + 4;
  } while (bVar3);
LAB_0022125f:
  fVar111 = auVar112._0_4_;
  auVar110._8_4_ = 0x3effffff;
  auVar110._0_8_ = 0x3effffff3effffff;
  auVar110._12_4_ = 0x3effffff;
  auVar109._8_4_ = 0x80000000;
  auVar109._0_8_ = 0x8000000080000000;
  auVar109._12_4_ = 0x80000000;
  auVar70 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 0.5)),auVar109,0xf8);
  auVar70 = ZEXT416((uint)(fVar111 * 0.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 1.5)),auVar109,0xf8);
  auVar71 = ZEXT416((uint)(fVar111 * 1.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 2.5)),auVar109,0xf8);
  auVar72 = ZEXT416((uint)(fVar111 * 2.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 3.5)),auVar109,0xf8);
  auVar73 = ZEXT416((uint)(fVar111 * 3.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 4.5)),auVar109,0xf8);
  auVar74 = ZEXT416((uint)(fVar111 * 4.5 + auVar74._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 5.5)),auVar109,0xf8);
  auVar75 = ZEXT416((uint)(fVar111 * 5.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 6.5)),auVar109,0xf8);
  auVar76 = ZEXT416((uint)(fVar111 * 6.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 7.5)),auVar109,0xf8);
  auVar77 = ZEXT416((uint)(auVar77._0_4_ + fVar111 * 7.5));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 8.5)),auVar109,0xf8);
  auVar78 = ZEXT416((uint)(fVar111 * 8.5 + auVar78._0_4_));
  auVar78 = vroundss_avx(auVar78,auVar78,0xb);
  auVar79 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 9.5)),auVar109,0xf8);
  auVar79 = ZEXT416((uint)(fVar111 * 9.5 + auVar79._0_4_));
  auVar79 = vroundss_avx(auVar79,auVar79,0xb);
  auVar80 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 10.5)),auVar109,0xf8);
  auVar80 = ZEXT416((uint)(fVar111 * 10.5 + auVar80._0_4_));
  auVar80 = vroundss_avx(auVar80,auVar80,0xb);
  auVar81 = vpternlogd_avx512vl(auVar110,ZEXT416((uint)(fVar111 * 11.5)),auVar109,0xf8);
  fVar90 = auVar72._0_4_;
  fVar85 = fVar90 + auVar71._0_4_;
  fVar8 = fVar90 + auVar70._0_4_;
  auVar72 = ZEXT416((uint)(fVar111 * 11.5 + auVar81._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  fVar111 = fVar90 - auVar70._0_4_;
  fVar84 = fVar90 - auVar71._0_4_;
  fVar97 = fVar90 - auVar73._0_4_;
  fVar9 = fVar90 - auVar74._0_4_;
  fVar10 = fVar90 - auVar75._0_4_;
  fVar90 = fVar90 - auVar76._0_4_;
  fVar106 = auVar77._0_4_;
  fVar11 = fVar106 - auVar73._0_4_;
  fVar12 = fVar106 - auVar74._0_4_;
  fVar13 = fVar106 - auVar75._0_4_;
  fVar14 = fVar106 - auVar76._0_4_;
  fVar15 = fVar106 - auVar78._0_4_;
  fVar16 = fVar106 - auVar79._0_4_;
  fVar17 = fVar106 - auVar80._0_4_;
  fVar106 = fVar106 - auVar72._0_4_;
  gauss_s1_c0[0] = expf(fVar85 * fVar85 * fVar83);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar83);
  gauss_s1_c0[2] = expf(fVar111 * fVar111 * fVar83);
  gauss_s1_c0[3] = expf(fVar84 * fVar84 * fVar83);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar97 * fVar97 * fVar83);
  gauss_s1_c0[6] = expf(fVar9 * fVar9 * fVar83);
  gauss_s1_c0[7] = expf(fVar10 * fVar10 * fVar83);
  gauss_s1_c0[8] = expf(fVar90 * fVar90 * fVar83);
  gauss_s1_c1[0] = expf(fVar11 * fVar11 * fVar83);
  gauss_s1_c1[1] = expf(fVar12 * fVar12 * fVar83);
  gauss_s1_c1[2] = expf(fVar13 * fVar13 * fVar83);
  gauss_s1_c1[3] = expf(fVar14 * fVar14 * fVar83);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar15 * fVar15 * fVar83);
  gauss_s1_c1[6] = expf(fVar16 * fVar16 * fVar83);
  gauss_s1_c1[7] = expf(fVar17 * fVar17 * fVar83);
  gauss_s1_c1[8] = expf(fVar106 * fVar106 * fVar83);
  auVar89._8_4_ = 0x7fffffff;
  auVar89._0_8_ = 0x7fffffff7fffffff;
  auVar89._12_4_ = 0x7fffffff;
  uVar42 = 0xfffffff8;
  fVar85 = 0.0;
  lVar65 = 0;
  lVar64 = 0;
  local_148 = 0;
  do {
    pfVar53 = gauss_s1_c1;
    uVar41 = (uint)uVar42;
    if (uVar41 != 7) {
      pfVar53 = gauss_s1_c0;
    }
    lVar63 = (long)local_148;
    lVar64 = (long)(int)lVar64;
    if (uVar41 == 0xfffffff8) {
      pfVar53 = gauss_s1_c1;
    }
    uVar58 = 0;
    local_148 = local_148 + 4;
    uVar52 = 0xfffffff8;
    lVar55 = (long)haarResponseX + lVar65;
    lVar44 = (long)haarResponseY + lVar65;
    do {
      pfVar67 = gauss_s1_c1;
      if (uVar52 != 7) {
        pfVar67 = gauss_s1_c0;
      }
      auVar105 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar52 == 0xfffffff8) {
        pfVar67 = gauss_s1_c1;
      }
      uVar68 = (ulong)(uVar52 >> 0x1c & 0xfffffff8);
      uVar43 = uVar58;
      lVar47 = lVar44;
      lVar66 = lVar55;
      do {
        lVar56 = 0;
        pfVar61 = (float *)((long)pfVar53 + (ulong)(uint)((int)(uVar42 >> 0x1f) << 5));
        do {
          fVar8 = pfVar67[uVar68] * *pfVar61;
          pfVar61 = pfVar61 + (ulong)(~uVar41 >> 0x1f) * 2 + -1;
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar47 + lVar56 * 4)),
                                  ZEXT416(*(uint *)(lVar66 + lVar56 * 4)),0x10);
          lVar56 = lVar56 + 1;
          auVar99._0_4_ = fVar8 * auVar70._0_4_;
          auVar99._4_4_ = fVar8 * auVar70._4_4_;
          auVar99._8_4_ = fVar8 * auVar70._8_4_;
          auVar99._12_4_ = fVar8 * auVar70._12_4_;
          auVar70 = vandps_avx(auVar99,auVar89);
          auVar70 = vmovlhps_avx(auVar99,auVar70);
          auVar91._0_4_ = auVar105._0_4_ + auVar70._0_4_;
          auVar91._4_4_ = auVar105._4_4_ + auVar70._4_4_;
          auVar91._8_4_ = auVar105._8_4_ + auVar70._8_4_;
          auVar91._12_4_ = auVar105._12_4_ + auVar70._12_4_;
          auVar105 = ZEXT1664(auVar91);
        } while (lVar56 != 9);
        uVar43 = uVar43 + 0x18;
        uVar68 = uVar68 + (ulong)(-1 < (int)uVar52) * 2 + -1;
        lVar66 = lVar66 + 0x60;
        lVar47 = lVar47 + 0x60;
      } while (uVar43 < uVar52 * 0x18 + 0x198);
      uVar52 = uVar52 + 5;
      uVar58 = uVar58 + 0x78;
      fVar8 = gauss_s2_arr[lVar63];
      auVar22._4_4_ = fVar8;
      auVar22._0_4_ = fVar8;
      auVar22._8_4_ = fVar8;
      auVar22._12_4_ = fVar8;
      auVar73 = vmulps_avx512vl(auVar91,auVar22);
      lVar63 = lVar63 + 1;
      auVar92._0_4_ = auVar73._0_4_ * auVar73._0_4_;
      auVar92._4_4_ = auVar73._4_4_ * auVar73._4_4_;
      auVar92._8_4_ = auVar73._8_4_ * auVar73._8_4_;
      auVar92._12_4_ = auVar73._12_4_ * auVar73._12_4_;
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar64) = auVar73;
      lVar64 = lVar64 + 4;
      lVar55 = lVar55 + 0x1e0;
      lVar44 = lVar44 + 0x1e0;
      auVar70 = vmovshdup_avx(auVar92);
      auVar72 = vfmadd231ss_fma(auVar70,auVar73,auVar73);
      auVar70 = vshufps_avx(auVar73,auVar73,0xff);
      auVar71 = vfmadd213ss_fma(auVar71,auVar71,auVar72);
      auVar70 = vfmadd213ss_fma(auVar70,auVar70,auVar71);
      fVar85 = fVar85 + auVar70._0_4_;
    } while (local_148 != (int)lVar63);
    lVar65 = lVar65 + 0x14;
    uVar42 = (ulong)(uVar41 + 5);
  } while ((int)uVar41 < 3);
  if (fVar85 < 0.0) {
    fVar85 = sqrtf(fVar85);
  }
  else {
    auVar70 = vsqrtss_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
    fVar85 = auVar70._0_4_;
  }
  lVar65 = 0;
  auVar105 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar85)));
  do {
    auVar107 = vmulps_avx512f(auVar105,*(undefined1 (*) [64])(ipoint->descriptor + lVar65));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar65) = auVar107;
    lVar65 = lVar65 + 0x10;
  } while (lVar65 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_6_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}